

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::WriteDependerConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  _Rb_tree_node_base *__k;
  TargetType TVar1;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  bool *pbVar5;
  iterator iVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  long *plVar9;
  bool bVar10;
  string libName;
  string connectionName;
  string myNodeName;
  long *local_e0;
  size_t local_d8;
  long local_d0 [2];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  _Base_ptr local_b8;
  key_type local_b0;
  long *local_90;
  long local_88;
  long local_80 [2];
  bool *local_70;
  bool *local_68;
  bool *local_60;
  bool *local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  long local_38;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find(&(this->TargetPtrs)._M_t,targetName);
  local_b8 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header;
  if ((cVar3._M_node != local_b8) &&
     (WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar3._M_node + 2),insertedNodes,str),
     *(long *)(cVar3._M_node + 2) != 0)) {
    local_40 = &this->TargetNamesNodes;
    local_c0 = insertedNodes;
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_40->_M_t,targetName);
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,*(long *)(cVar4._M_node + 2),
               (long)&(cVar4._M_node[2]._M_parent)->_M_color + *(long *)(cVar4._M_node + 2));
    p_Var8 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var8 != local_b8) {
      local_60 = &this->GenerateForModuleLibs;
      local_68 = &this->GenerateForSharedLibs;
      local_70 = &this->GenerateForStaticLibs;
      local_58 = &this->GenerateForExecutables;
      local_48 = &(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_50 = &(insertedConnections->_M_t)._M_impl.super__Rb_tree_header._M_header;
      do {
        if (*(cmGeneratorTarget **)(p_Var8 + 2) != (cmGeneratorTarget *)0x0) {
          TVar1 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var8 + 2));
          pbVar5 = local_58;
          switch(TVar1) {
          case EXECUTABLE:
            break;
          case STATIC_LIBRARY:
            pbVar5 = local_70;
            break;
          case SHARED_LIBRARY:
            pbVar5 = local_68;
            break;
          case MODULE_LIBRARY:
            pbVar5 = local_60;
            break;
          default:
            goto switchD_003f3d44_default;
          }
          if (*pbVar5 != false) {
            local_38 = **(long **)(p_Var8 + 2);
            plVar9 = *(long **)(local_38 + 0x1e8);
            if (plVar9 != *(long **)(local_38 + 0x1f0)) {
              __k = p_Var8 + 1;
              do {
                local_e0 = local_d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_e0,*plVar9,plVar9[1] + *plVar9);
                if (local_d8 == targetName->_M_string_length) {
                  if (local_d8 == 0) {
                    bVar10 = true;
                  }
                  else {
                    iVar2 = bcmp(local_e0,(targetName->_M_dataplus)._M_p,local_d8);
                    bVar10 = iVar2 == 0;
                  }
                }
                else {
                  bVar10 = false;
                }
                if (bVar10) {
                  cVar4 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::find(&local_40->_M_t,(key_type *)__k);
                  if (cVar4._M_node != local_48) {
                    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b0,*(long *)(cVar4._M_node + 2),
                               (long)&(cVar4._M_node[2]._M_parent)->_M_color +
                               *(long *)(cVar4._M_node + 2));
                    std::__cxx11::string::append((char *)&local_b0);
                    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
                    iVar6 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&insertedConnections->_M_t,&local_b0);
                    if (iVar6._M_node == local_50) {
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)insertedConnections,&local_b0);
                      WriteNode(this,(string *)__k,*(cmGeneratorTarget **)(p_Var8 + 2),local_c0,str)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,"    \"",5);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)str,*(char **)(cVar4._M_node + 2),
                                          (long)cVar4._M_node[2]._M_parent);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" -> \"",6);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar7,(char *)local_90,local_88);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)str," // ",4);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)str,(targetName->_M_dataplus)._M_p,
                                          targetName->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -> ",4);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar7,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
                      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                      std::ostream::put((char)poVar7);
                      std::ostream::flush();
                      WriteDependerConnections(this,(string *)__k,local_c0,insertedConnections,str);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (local_e0 != local_d0) {
                    operator_delete(local_e0,local_d0[0] + 1);
                  }
                  if (bVar10) break;
                }
                else if (local_e0 != local_d0) {
                  operator_delete(local_e0,local_d0[0] + 1);
                }
                plVar9 = plVar9 + 5;
              } while (plVar9 != *(long **)(local_38 + 0x1f0));
            }
          }
        }
switchD_003f3d44_default:
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != local_b8);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteDependerConnections(
  const std::string& targetName, std::set<std::string>& insertedNodes,
  std::set<std::string>& insertedConnections, cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget*>::const_iterator targetPtrIt =
    this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end()) // not found at all
  {
    return;
  }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == CM_NULLPTR) // it's an external library
  {
    return;
  }

  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;

  // now search who links against me
  for (std::map<std::string, const cmGeneratorTarget*>::const_iterator
         dependerIt = this->TargetPtrs.begin();
       dependerIt != this->TargetPtrs.end(); ++dependerIt) {
    if (dependerIt->second == CM_NULLPTR) {
      continue;
    }

    if (!this->GenerateForTargetType(dependerIt->second->GetType())) {
      continue;
    }

    // Now we have a target, check whether it links against targetName.
    // If so, draw a connection, and then continue with dependers on that one.
    const cmTarget::LinkLibraryVectorType* ll =
      &(dependerIt->second->Target->GetOriginalLinkLibraries());

    for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
         llit != ll->end(); ++llit) {
      std::string libName = llit->first;
      if (libName == targetName) {
        // So this target links against targetName.
        std::map<std::string, std::string>::const_iterator dependerNodeNameIt =
          this->TargetNamesNodes.find(dependerIt->first);

        if (dependerNodeNameIt != this->TargetNamesNodes.end()) {
          std::string connectionName = dependerNodeNameIt->second;
          connectionName += "-";
          connectionName += myNodeName;

          if (insertedConnections.find(connectionName) ==
              insertedConnections.end()) {
            insertedConnections.insert(connectionName);
            this->WriteNode(dependerIt->first, dependerIt->second,
                            insertedNodes, str);

            str << "    \"" << dependerNodeNameIt->second << "\" -> \""
                << myNodeName << "\"";
            str << " // " << targetName << " -> " << dependerIt->first
                << std::endl;
            this->WriteDependerConnections(dependerIt->first, insertedNodes,
                                           insertedConnections, str);
          }
        }
        break;
      }
    }
  }
}